

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-after-read-timeout.c
# Opt level: O2

void on_client_connect(uv_connect_t *conn_req,int status)

{
  int iVar1;
  undefined8 uVar2;
  int64_t eval_b;
  int64_t eval_a;
  
  iVar1 = uv_read_start(&client,on_client_alloc,on_client_read);
  eval_a = (int64_t)iVar1;
  if (eval_a == 0) {
    iVar1 = uv_timer_start(&timer,on_client_timeout,1000,0);
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      return;
    }
    uVar2 = 0x36;
  }
  else {
    uVar2 = 0x33;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-after-read-timeout.c"
          ,uVar2,"r","==","0",eval_a,"==",0);
  abort();
}

Assistant:

static void on_client_connect(uv_connect_t* conn_req, int status) {
  int r;

  r = uv_read_start((uv_stream_t*) &client, on_client_alloc, on_client_read);
  ASSERT_OK(r);

  r = uv_timer_start(&timer, on_client_timeout, 1000, 0);
  ASSERT_OK(r);
}